

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O0

bool __thiscall blc::network::SSLSocket::writable(SSLSocket *this)

{
  int iVar1;
  long in_RDI;
  fd_set *__arr;
  uint __i;
  timeval timeout;
  fd_set fds;
  uint local_a4;
  timeval local_a0;
  fd_set local_90;
  bool local_1;
  
  memset(&local_a0,0,0x10);
  if ((*(byte *)(in_RDI + 0x78) & 1) == 0) {
    local_1 = false;
  }
  else {
    for (local_a4 = 0; local_a4 < 0x10; local_a4 = local_a4 + 1) {
      local_90.fds_bits[local_a4] = 0;
    }
    iVar1 = *(int *)(in_RDI + 0x44) / 0x40;
    local_90.fds_bits[iVar1] =
         1L << ((byte)((long)*(int *)(in_RDI + 0x44) % 0x40) & 0x3f) | local_90.fds_bits[iVar1];
    iVar1 = select(*(int *)(in_RDI + 0x44) + 1,(fd_set *)0x0,&local_90,(fd_set *)0x0,&local_a0);
    if (iVar1 < 1) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool blc::network::SSLSocket::writable() const {
	fd_set fds;
	struct timeval timeout = {0, 0};

	if (this->_opened == false)
		return (false);
	FD_ZERO(&fds);
	FD_SET(this->_socket, &fds);
	if (select(this->_socket + 1, 0, &fds, 0, &timeout) <= 0)
		return (false);
	return (true);
}